

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_set_target_rate(AV1_COMP *cpi,int width,int height)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  FIRSTPASS_STATS *pFVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  uVar1 = (cpi->rc).base_frame_target;
  uVar9 = (ulong)uVar1;
  if (((cpi->oxcf).rc_cfg.mode & ~AOM_CQ) == AOM_VBR) {
    pAVar2 = cpi->ppi;
    pFVar3 = ((pAVar2->twopass).stats_buf_ctx)->total_stats;
    if (pFVar3 == (FIRSTPASS_STATS *)0x0) {
      dVar13 = 0.0;
    }
    else {
      dVar13 = pFVar3->count;
    }
    uVar12 = (ulong)(int)uVar1;
    dVar13 = dVar13 - (double)(cpi->common).current_frame.frame_number;
    dVar14 = 16.0;
    if (dVar13 <= 16.0) {
      dVar14 = dVar13;
    }
    if (0 < (int)dVar14) {
      lVar4 = (pAVar2->p_rc).vbr_bits_off_target;
      lVar6 = lVar4 / (long)(ulong)(uint)(int)dVar14;
      lVar10 = -lVar6;
      if (0 < lVar6) {
        lVar10 = lVar6;
      }
      if ((int)uVar1 / 2 <= lVar10) {
        lVar10 = (long)((int)uVar1 / 2);
      }
      lVar6 = -lVar10;
      if (-1 < lVar4) {
        lVar6 = lVar10;
      }
      uVar12 = uVar12 + lVar6;
    }
    iVar5 = frame_is_kf_gf_arf(cpi);
    if (((iVar5 == 0) && (uVar9 = (pAVar2->p_rc).vbr_bits_off_target_fast, uVar9 != 0)) &&
       ((cpi->rc).is_src_frame_alt_ref == 0)) {
      uVar7 = (ulong)(cpi->rc).avg_frame_bandwidth;
      if ((long)uVar7 < (long)uVar12) {
        uVar7 = uVar12;
      }
      uVar11 = uVar7;
      if ((long)uVar9 < (long)uVar7) {
        uVar11 = uVar9;
      }
      uVar8 = (long)uVar9 / 8;
      if ((long)uVar9 / 8 < (long)uVar7 / 8) {
        uVar8 = (long)uVar7 / 8;
      }
      if ((long)uVar11 < (long)uVar8) {
        uVar8 = uVar11;
      }
      if (0x7ffffffe < (long)uVar8) {
        uVar8 = 0x7fffffff;
      }
      uVar9 = 0;
      if (0 < (long)uVar8) {
        uVar9 = uVar8;
      }
      uVar12 = uVar12 + uVar9;
      (cpi->rc).frame_level_fast_extra_bits = (int)uVar8;
      cpi->do_update_vbr_bits_off_target_fast = 1;
    }
    uVar9 = 0x7fffffff;
    if ((long)uVar12 < 0x7fffffff) {
      uVar9 = uVar12;
    }
  }
  av1_rc_set_frame_target(cpi,(int)uVar9,width,height);
  return;
}

Assistant:

void av1_set_target_rate(AV1_COMP *cpi, int width, int height) {
  RATE_CONTROL *const rc = &cpi->rc;
  int target_rate = rc->base_frame_target;

  // Correction to rate target based on prior over or under shoot.
  if (cpi->oxcf.rc_cfg.mode == AOM_VBR || cpi->oxcf.rc_cfg.mode == AOM_CQ)
    vbr_rate_correction(cpi, &target_rate);
  av1_rc_set_frame_target(cpi, target_rate, width, height);
}